

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfSelectClient.cpp
# Opt level: O0

void __thiscall xmrig::SelfSelectClient::onHttpData(SelfSelectClient *this,HttpData *data)

{
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ParseErrorCode parseErrorCode;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  String *this_00;
  char *pcVar5;
  char *pcVar6;
  Type obj;
  int __noclose;
  long in_RSI;
  SelfSelectClient *in_RDI;
  int64_t id;
  Document doc;
  Ch *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  int64_t in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  CrtAllocator *in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff20;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  Value *in_stack_ffffffffffffff40;
  Value *in_stack_ffffffffffffff48;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_ffffffffffffff50;
  undefined6 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5e;
  
  if (*(int *)(in_RSI + 4) == 200) {
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                       *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18)
    ;
    iVar3 = std::__cxx11::string::c_str();
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::Parse((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
            in_stack_fffffffffffffef8);
    uVar1 = rapidjson::
            GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::HasParseError((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                             *)0x1f1221);
    if ((bool)uVar1) {
      bVar2 = isQuiet(in_RDI);
      if (!bVar2) {
        iVar4 = (*(in_RDI->super_IClient)._vptr_IClient[10])();
        iVar3 = Pool::daemon((Pool *)CONCAT44(extraout_var,iVar4),iVar3,__noclose);
        this_00 = Url::url((Url *)CONCAT44(extraout_var_00,iVar3));
        pcVar6 = String::data(this_00);
        parseErrorCode =
             rapidjson::
             GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::GetParseError((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                              *)0x1f12a7);
        pcVar5 = rapidjson::GetParseError_En(parseErrorCode);
        Log::print(ERR,"[%s] JSON decode failed: \"%s\"",pcVar6,pcVar5);
      }
      retry((SelfSelectClient *)0x1f130e);
    }
    else {
      pcVar6 = (char *)Json::getInt64((Value *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                                      in_stack_ffffffffffffff08);
      if (((long)pcVar6 < 1) || (in_RDI->m_sequence - (long)pcVar6 == 1)) {
        obj = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
        Json::getObject(obj,pcVar6);
        in_stack_ffffffffffffff07 =
             parseResponse((SelfSelectClient *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff5e,
                                                   in_stack_ffffffffffffff58)),
                           (int64_t)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                           in_stack_ffffffffffffff40);
        if (!(bool)in_stack_ffffffffffffff07) {
          retry((SelfSelectClient *)0x1f13f7);
        }
      }
    }
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::~GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                        *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  }
  else {
    retry((SelfSelectClient *)0x1f11cf);
  }
  return;
}

Assistant:

void xmrig::SelfSelectClient::onHttpData(const HttpData &data)
{
    if (data.status != HTTP_STATUS_OK) {
        return retry();
    }

    LOG_DEBUG("[%s] received (%d bytes): \"%.*s\"", pool().daemon().url().data(), static_cast<int>(data.body.size()), static_cast<int>(data.body.size()), data.body.c_str());

    rapidjson::Document doc;
    if (doc.Parse(data.body.c_str()).HasParseError()) {
        if (!isQuiet()) {
            LOG_ERR("[%s] JSON decode failed: \"%s\"",  pool().daemon().url().data(), rapidjson::GetParseError_En(doc.GetParseError()));
        }

        return retry();
    }

    const int64_t id = Json::getInt64(doc, "id", -1);
    if (id > 0 && m_sequence - id != 1) {
        return;
    }

    if (!parseResponse(id, doc["result"], Json::getObject(doc, "error"))) {
        retry();
    }
}